

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uconv.h
# Opt level: O2

long __thiscall
booster::locale::impl_icu::icu_std_converter<char,1>::uconv::go_abi_cxx11_(void *this)

{
  undefined8 *in_RSI;
  UErrorCode err;
  
  *(long *)this = (long)this + 0x10;
  *(undefined8 *)((long)this + 8) = 0;
  *(undefined1 *)((long)this + 0x10) = 0;
  std::__cxx11::string::resize((ulong)this);
  ucnv_fromUChars_70(*in_RSI,*this,*(undefined4 *)((long)this + 8));
  check_and_throw_icu_error(U_ZERO_ERROR);
  std::__cxx11::string::resize((ulong)this);
  return (long)this;
}

Assistant:

string_type go(UChar const *buf,int length,int max_size)
            {
                string_type res;
                res.resize(UCNV_GET_MAX_BYTES_FOR_STRING(length,max_size));
                char *ptr=reinterpret_cast<char *>(&res[0]);
                UErrorCode err=U_ZERO_ERROR;
                int n = ucnv_fromUChars(cvt_,ptr,res.size(),buf,length,&err);
                check_and_throw_icu_error(err);
                res.resize(n);
                return res;
            }